

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

void ssl_write_max_fragment_length_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  uchar *puVar1;
  uchar *end;
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  puVar1 = ssl->out_msg;
  *olen = 0;
  if ((*(uint *)&ssl->conf->field_0x164 >> 7 & 7) != 0) {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x163,"client hello, adding max_fragment_length extension");
    if ((puVar1 + 0x4000 < buf) || ((ulong)((long)(puVar1 + 0x4000) - (long)buf) < 5)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x167,"buffer too small");
    }
    else {
      *buf = '\0';
      buf[1] = '\x01';
      buf[2] = '\0';
      buf[3] = '\x01';
      buf[4] = (byte)(*(uint *)&ssl->conf->field_0x164 >> 7) & 7;
      *olen = 5;
    }
  }
  return;
}

Assistant:

static void ssl_write_max_fragment_length_ext( mbedtls_ssl_context *ssl,
                                               unsigned char *buf,
                                               size_t *olen )
{
    unsigned char *p = buf;

    if( ssl->session_negotiate->mfl_code == MBEDTLS_SSL_MAX_FRAG_LEN_NONE )
    {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, max_fragment_length extension" ) );

    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_MAX_FRAGMENT_LENGTH >> 8 ) & 0xFF );
    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_MAX_FRAGMENT_LENGTH      ) & 0xFF );

    *p++ = 0x00;
    *p++ = 1;

    *p++ = ssl->session_negotiate->mfl_code;

    *olen = 5;
}